

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptArray::GetPropertyQuery
          (JavascriptArray *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ScriptContext *this_00;
  BOOL BVar1;
  int iVar2;
  PropertyQueryFlags PVar3;
  uint local_34 [2];
  uint32 index;
  
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  BVar1 = GetPropertyBuiltIns(this,propertyId,value);
  if (BVar1 == 0) {
    this_00 = (((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    BVar1 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_34);
    if (BVar1 == 0) {
      PVar3 = DynamicObject::GetPropertyQuery
                        ((DynamicObject *)this,originalInstance,propertyId,value,info,requestContext
                        );
    }
    else {
      iVar2 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x26])(this,this,(ulong)local_34[0],value,this_00);
      PVar3 = (PropertyQueryFlags)(iVar2 == 1);
    }
  }
  else {
    PVar3 = Property_Found;
  }
  return PVar3;
}

Assistant:

PropertyQueryFlags JavascriptArray::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        if (GetPropertyBuiltIns(propertyId, value))
        {
            return PropertyQueryFlags::Property_Found;
        }

        ScriptContext* scriptContext = GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(this->GetItem(this, index, value, scriptContext));
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext);
    }